

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

void xor_buffered_increment_counter
               (uint32_t index,uint64_t hash,xor_setbuffer_t *buffer,xor_xorset_t *sets)

{
  byte bVar1;
  xor_keyindex_t *pxVar2;
  uint32_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint uVar7;
  uint uVar8;
  
  bVar1 = (byte)buffer->insignificantbits;
  uVar7 = index >> (bVar1 & 0x1f);
  pxVar2 = buffer->buffer;
  puVar3 = buffer->counts;
  uVar8 = (uVar7 << (bVar1 & 0x1f)) + puVar3[uVar7];
  pxVar2[uVar8].index = index;
  pxVar2[uVar8].hash = hash;
  uVar8 = puVar3[uVar7] + 1;
  puVar3[uVar7] = uVar8;
  if (uVar8 == buffer->slotsize) {
    uVar5 = (ulong)(uVar7 << ((byte)buffer->insignificantbits & 0x1f));
    uVar4 = uVar8 + uVar5;
    puVar6 = &pxVar2[uVar5].index;
    for (; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      uVar8 = *puVar6;
      sets[uVar8].xormask = sets[uVar8].xormask ^ ((xor_keyindex_t *)(puVar6 + -2))->hash;
      sets[uVar8].count = sets[uVar8].count + 1;
      puVar6 = puVar6 + 4;
    }
    puVar3[uVar7] = 0;
  }
  return;
}

Assistant:

static inline void xor_buffered_increment_counter(uint32_t index, uint64_t hash,
                                                  xor_setbuffer_t *buffer,
                                                  xor_xorset_t *sets) {
  uint32_t slot = index >> (uint32_t)buffer->insignificantbits;
  size_t addr = buffer->counts[slot] + (slot << (uint32_t)buffer->insignificantbits);
  buffer->buffer[addr].index = index;
  buffer->buffer[addr].hash = hash;
  buffer->counts[slot]++;
  size_t offset = (slot << (uint32_t)buffer->insignificantbits);
  if (buffer->counts[slot] == buffer->slotsize) {
    // must empty the buffer
    for (size_t i = offset; i < buffer->slotsize + offset; i++) {
      xor_keyindex_t ki =
          buffer->buffer[i];
      sets[ki.index].xormask ^= ki.hash;
      sets[ki.index].count++;
    }
    buffer->counts[slot] = 0;
  }
}